

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O0

vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
* __thiscall wallet::anon_unknown_5::WalletLoaderImpl::getWallets(WalletLoaderImpl *this)

{
  long lVar1;
  bool bVar2;
  WalletContext *in_RSI;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *in_RDI;
  long in_FS_OFFSET;
  shared_ptr<wallet::CWallet> *wallet;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *__range2;
  vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
  *wallets;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
  *in_stack_ffffffffffffff68;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *in_stack_ffffffffffffff70;
  vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  *wallet_00;
  WalletContext *in_stack_ffffffffffffff90;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  wallet_00 = in_RDI;
  _GLOBAL__N_1::std::
  vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
  ::vector(in_stack_ffffffffffffff68);
  GetWallets(in_stack_ffffffffffffff90);
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::begin(in_stack_ffffffffffffff70);
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::end(in_stack_ffffffffffffff70);
  while (bVar2 = __gnu_cxx::
                 operator==<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                           ((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                             *)in_RDI,
                            (__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                             *)in_stack_ffffffffffffff70), ((bVar2 ^ 0xffU) & 1) != 0) {
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
    ::operator*((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                 *)in_stack_ffffffffffffff68);
    interfaces::MakeWallet(in_RSI,(shared_ptr<wallet::CWallet> *)wallet_00);
    std::
    vector<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>,std::allocator<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>>
    ::emplace_back<std::unique_ptr<interfaces::Wallet,std::default_delete<interfaces::Wallet>>>
              ((vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
                *)in_RSI,
               (unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> *)wallet_00
              );
    std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>::~unique_ptr
              ((unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_> *)in_RDI);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
    ::operator++((__normal_iterator<std::shared_ptr<wallet::CWallet>_*,_std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>_>
                  *)in_stack_ffffffffffffff68);
  }
  std::vector<std::shared_ptr<wallet::CWallet>,_std::allocator<std::shared_ptr<wallet::CWallet>_>_>
  ::~vector(in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (vector<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>,_std::allocator<std::unique_ptr<interfaces::Wallet,_std::default_delete<interfaces::Wallet>_>_>_>
          *)wallet_00;
}

Assistant:

std::vector<std::unique_ptr<Wallet>> getWallets() override
    {
        std::vector<std::unique_ptr<Wallet>> wallets;
        for (const auto& wallet : GetWallets(m_context)) {
            wallets.emplace_back(MakeWallet(m_context, wallet));
        }
        return wallets;
    }